

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioUtil.c
# Opt level: O2

FILE * Io_FileOpen(char *FileName,char *PathVar,char *Mode,int fVerbose)

{
  char *pcVar1;
  char *__ptr;
  FILE *pFVar2;
  char ActualFileName [4096];
  char local_1038 [4104];
  
  if ((PathVar != (char *)0x0) && (pcVar1 = Abc_FrameReadFlag(PathVar), pcVar1 != (char *)0x0)) {
    __ptr = Extra_UtilStrsav(pcVar1);
    pcVar1 = __ptr;
    do {
      pcVar1 = strtok(pcVar1,":");
      if (pcVar1 == (char *)0x0) {
        free(__ptr);
        return (FILE *)0x0;
      }
      snprintf(local_1038,0x1000,"%s/%s",pcVar1,FileName);
      pFVar2 = fopen(local_1038,Mode);
      pcVar1 = (char *)0x0;
    } while (pFVar2 == (FILE *)0x0);
    if (fVerbose != 0) {
      fprintf(_stdout,"Using file %s\n",local_1038);
    }
    free(__ptr);
    return (FILE *)pFVar2;
  }
  pFVar2 = fopen(FileName,Mode);
  return (FILE *)pFVar2;
}

Assistant:

FILE * Io_FileOpen( const char * FileName, const char * PathVar, const char * Mode, int fVerbose )
{
    char * t = 0, * c = 0, * i;

    if ( PathVar == 0 )
    {
        return fopen( FileName, Mode );
    }
    else
    {
        if ( (c = Abc_FrameReadFlag( (char*)PathVar )) )
        {
            char ActualFileName[4096];
            FILE * fp = 0;
            t = Extra_UtilStrsav( c );
            for (i = strtok( t, ":" ); i != 0; i = strtok( 0, ":") )
            {
#ifdef WIN32
                _snprintf ( ActualFileName, 4096, "%s/%s", i, FileName );
#else
                snprintf ( ActualFileName, 4096, "%s/%s", i, FileName );
#endif
                if ( ( fp = fopen ( ActualFileName, Mode ) ) )
                {
                    if ( fVerbose )
                    fprintf ( stdout, "Using file %s\n", ActualFileName );
                    ABC_FREE( t );
                    return fp;
                }
            }
            ABC_FREE( t );
            return 0;
        }
        else
        {
            return fopen( FileName, Mode );
        }
    }
}